

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void FAudio_INTERNAL_DecodePCM24
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  FAudioWaveFormatEx *pFVar3;
  long lVar4;
  byte *pbVar5;
  ulong uVar6;
  
  if (samples != 0) {
    pFVar3 = (voice->field_19).src.format;
    puVar1 = buffer->pAudioData + (uint)pFVar3->nBlockAlign * (voice->field_19).src.curBufferOffset;
    uVar2 = 0;
    do {
      if (pFVar3->nChannels != 0) {
        pbVar5 = puVar1 + 2;
        lVar4 = 0;
        uVar6 = 0;
        do {
          decodeCache[uVar6] =
               (float)((int)((uint)pbVar5[-2] << 8 |
                            (uint)pbVar5[-1] << 0x10 | (uint)*pbVar5 << 0x18) >> 8) / 8388607.0;
          uVar6 = uVar6 + 1;
          pFVar3 = (voice->field_19).src.format;
          pbVar5 = pbVar5 + 3;
          lVar4 = lVar4 + 4;
        } while (uVar6 < pFVar3->nChannels);
        decodeCache = (float *)((long)decodeCache + lVar4);
      }
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + pFVar3->nBlockAlign;
    } while (uVar2 != samples);
  }
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM24(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	uint32_t i, j;
	const uint8_t *buf;
	LOG_FUNC_ENTER(voice->audio)

	/* FIXME: Uh... is this something that can be SIMD-ified? */
	buf = buffer->pAudioData + (
		voice->src.curBufferOffset * voice->src.format->nBlockAlign
	);
	for (i = 0; i < samples; i += 1, buf += voice->src.format->nBlockAlign)
	for (j = 0; j < voice->src.format->nChannels; j += 1)
	{
		*decodeCache++ = ((int32_t) (
			((uint32_t) buf[(j * 3) + 2] << 24) |
			((uint32_t) buf[(j * 3) + 1] << 16) |
			((uint32_t) buf[(j * 3) + 0] << 8)
		) >> 8) / 8388607.0f;
	}

	LOG_FUNC_EXIT(voice->audio)
}